

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O1

string * __thiscall
ot::commissioner::utils::Hex_abi_cxx11_
          (string *__return_storage_ptr__,utils *this,ByteArray *aBytes)

{
  long lVar1;
  long lVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  lVar1 = *(long *)(this + 8);
  for (lVar2 = *(long *)this; lVar2 != lVar1; lVar2 = lVar2 + 1) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Hex(const ByteArray &aBytes)
{
    std::string str;
    for (auto byte : aBytes)
    {
        char c0 = (byte & 0xF0) >> 4;
        char c1 = byte & 0x0F;
        str.push_back(c0 < 10 ? (c0 + '0') : (c0 + 'a' - 10));
        str.push_back(c1 < 10 ? (c1 + '0') : (c1 + 'a' - 10));
    }
    return str;
}